

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomdiscard_a(iasctx *ctx,void *v,int spos)

{
  matches *pmVar1;
  
  if (((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) &&
     (ctx->atoms[spos]->expr->type == EASM_EXPR_DISCARD)) {
    pmVar1 = alwaysmatches(spos + 1);
    return pmVar1;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomdiscard_a APROTO {
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	if (e->type == EASM_EXPR_DISCARD) {
		return alwaysmatches(spos+1);
	} else {
		return 0;
	}
}